

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O0

SRC_STATE * zoh_copy(SRC_STATE *state)

{
  void *__src;
  void *__dest;
  void *pvVar1;
  ZOH_DATA *to_priv;
  ZOH_DATA *from_priv;
  SRC_STATE *to;
  SRC_STATE *state_local;
  
  if (state != (SRC_STATE *)0x0) {
    if (state->private_data == (void *)0x0) {
      state_local = (SRC_STATE *)0x0;
    }
    else {
      state_local = (SRC_STATE *)calloc(1,0x50);
      if (state_local == (SRC_STATE *)0x0) {
        state_local = (SRC_STATE *)0x0;
      }
      else {
        memcpy(state_local,state,0x50);
        __src = state->private_data;
        __dest = calloc(1,0x30);
        if (__dest == (void *)0x0) {
          free(state_local);
          state_local = (SRC_STATE *)0x0;
        }
        else {
          memcpy(__dest,__src,0x30);
          pvVar1 = malloc((long)state->channels << 2);
          *(void **)((long)__dest + 0x28) = pvVar1;
          if (*(long *)((long)__dest + 0x28) == 0) {
            free(state_local);
            free(__dest);
            state_local = (SRC_STATE *)0x0;
          }
          else {
            memcpy(*(void **)((long)__dest + 0x28),*(void **)((long)__src + 0x28),
                   (long)state->channels << 2);
            state_local->private_data = __dest;
          }
        }
      }
    }
    return state_local;
  }
  __assert_fail("state != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_zoh.c"
                ,0xee,"SRC_STATE *zoh_copy(SRC_STATE *)");
}

Assistant:

static SRC_STATE *
zoh_copy (SRC_STATE *state)
{
	assert (state != NULL) ;

	if (state->private_data == NULL)
		return NULL ;

	SRC_STATE *to = (SRC_STATE *) calloc (1, sizeof (SRC_STATE)) ;
	if (!to)
		return NULL ;
	memcpy (to, state, sizeof (SRC_STATE)) ;

	ZOH_DATA* from_priv = (ZOH_DATA*) state->private_data ;
	ZOH_DATA *to_priv = (ZOH_DATA *) calloc (1, sizeof (ZOH_DATA)) ;
	if (!to_priv)
	{
		free (to) ;
		return NULL ;
	}

	memcpy (to_priv, from_priv, sizeof (ZOH_DATA)) ;
	to_priv->last_value = (float *) malloc (sizeof (float) * state->channels) ;
	if (!to_priv->last_value)
	{
		free (to) ;
		free (to_priv) ;
		return NULL ;
	}
	memcpy (to_priv->last_value, from_priv->last_value, sizeof (float) * state->channels) ;

	to->private_data = to_priv ;

	return to ;
}